

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
          (uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *this,char *str_result,
          uint_fast8_t base_rep,bool show_base,bool show_pos,bool is_uppercase,
          unsigned_fast_type field_width,char fill_char_str)

{
  char cVar1;
  uint uVar2;
  void *__s;
  ulong uVar3;
  pointer pvVar4;
  unsigned_fast_type uVar5;
  pointer pvVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined7 in_register_00000081;
  bool bVar13;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> tmp;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_98;
  undefined4 local_7c;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_78;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_60;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> local_48;
  
  iVar8 = (int)CONCAT71(in_register_00000011,base_rep);
  uVar12 = (undefined4)CONCAT71(in_register_00000081,show_pos);
  if (iVar8 == 0x10) {
    local_7c = uVar12;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_98,
                  (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    local_98._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
    __s = operator_new(0x8008);
    memset(__s,0,0x8008);
    if ((ulong)local_98.elem_count != 0) {
      lVar10 = 0;
      do {
        if (*(int *)((long)local_98.elems + lVar10) != 0) {
          uVar5 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::
                  extract_hex_digits<false,_nullptr>
                            ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
                             &local_98,(char *)((long)__s + 0x8007),is_uppercase);
          uVar3 = 0x8007 - uVar5;
          goto LAB_0013bd9e;
        }
        lVar10 = lVar10 + 4;
      } while ((ulong)local_98.elem_count << 2 != lVar10);
    }
    *(undefined1 *)((long)__s + 0x8006) = 0x30;
    uVar3 = 0x8006;
LAB_0013bd9e:
    if ((show_base) && (1 < (long)uVar3)) {
      *(byte *)((long)__s + (ulong)((int)uVar3 - 1)) = !is_uppercase << 5 | 0x58;
      uVar3 = uVar3 - 2;
      *(undefined1 *)((long)__s + (uVar3 & 0xffffffff)) = 0x30;
    }
    if (((char)local_7c != '\0') && (0 < (long)uVar3)) {
      uVar3 = uVar3 - 1;
      *(undefined1 *)((long)__s + (uVar3 & 0xffffffff)) = 0x2b;
    }
    if (field_width != 0) {
      lVar10 = 0;
      if (field_width < 0x8008) {
        lVar10 = 0x8007 - field_width;
      }
      while (lVar10 < (long)uVar3) {
        uVar3 = uVar3 - 1;
        *(char *)((long)__s + (uVar3 & 0xffffffff)) = fill_char_str;
      }
    }
    *(undefined1 *)((long)__s + 0x8007) = 0;
    lVar10 = 0;
    do {
      cVar1 = *(char *)((long)__s + lVar10 + uVar3);
      str_result[lVar10] = cVar1;
      lVar10 = lVar10 + 1;
    } while (cVar1 != '\0');
    uVar3 = 0x8008;
    goto LAB_0013beaa;
  }
  if (iVar8 == 10) {
    local_7c = uVar12;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_98,
                  (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    local_98._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
    __s = operator_new(0x9a26);
    memset(__s,0,0x9a26);
    uVar3 = (ulong)local_98.elem_count;
    if (uVar3 != 0) {
      pvVar6 = local_98.elems + uVar3;
      lVar10 = 0;
      do {
        if (*(int *)((long)local_98.elems + lVar10) != 0) {
          uVar3 = 0x9a25;
          pvVar4 = local_98.elems;
          goto LAB_0013bc2e;
        }
        lVar10 = lVar10 + 4;
      } while (uVar3 << 2 != lVar10);
    }
    *(undefined1 *)((long)__s + 0x9a24) = 0x30;
    uVar3 = 0x9a24;
    goto LAB_0013bb05;
  }
  if (iVar8 != 8) {
    return false;
  }
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (&local_98,
             (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this);
  local_98._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
  __s = operator_new(0xaab3);
  memset(__s,0,0xaab3);
  if ((ulong)local_98.elem_count != 0) {
    lVar10 = 0;
    do {
      if (*(int *)((long)local_98.elems + lVar10) != 0) {
        uVar3 = 0xaab2;
        goto LAB_0013bdde;
      }
      lVar10 = lVar10 + 4;
    } while ((ulong)local_98.elem_count << 2 != lVar10);
  }
  *(undefined1 *)((long)__s + 0xaab1) = 0x30;
  uVar3 = 0xaab1;
  goto LAB_0013ba2e;
  while( true ) {
    bVar13 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar13) {
      uVar3 = 0;
      goto LAB_0013bb21;
    }
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_60,&local_98);
    local_60._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
    lVar10 = 0x3ffc;
    uVar9 = 0;
    uVar7 = 0;
    do {
      uVar7 = CONCAT44((int)uVar7 + (int)uVar9 * -10,*(undefined4 *)((long)local_98.elems + lVar10))
      ;
      uVar9 = uVar7 / 10;
      *(int *)((long)local_98.elems + lVar10) = (int)uVar9;
      lVar10 = lVar10 + -4;
    } while (lVar10 != -4);
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_78,&local_98);
    local_78._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
    lVar10 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + (ulong)local_78.elems[lVar10] * 10;
      local_78.elems[lVar10] = (value_type)uVar7;
      uVar7 = uVar7 >> 0x20;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1000);
    operator-(&local_48,(uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_60,
              (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_78);
    *(char *)((long)__s + (uVar3 & 0xffffffff)) =
         (char)*local_48.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elems + '0';
    local_48.values.
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
    if ((ulong)local_48.values.
               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
               elem_count != 0) {
      operator_delete(local_48.values.
                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                      .elems,(ulong)local_48.values.
                                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                    .elem_count << 2);
    }
    local_78._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
    if ((ulong)local_78.elem_count != 0) {
      operator_delete(local_78.elems,(ulong)local_78.elem_count << 2);
    }
    local_60._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
    if ((ulong)local_60.elem_count != 0) {
      operator_delete(local_60.elems,(ulong)local_60.elem_count << 2);
    }
    pvVar6 = local_98.elems + local_98.elem_count;
    pvVar4 = local_98.elems;
    if ((ulong)local_98.elem_count == 0) break;
LAB_0013bc2e:
    if (*pvVar4 == 0) {
      pvVar4 = pvVar4 + 1;
      if (pvVar4 == pvVar6) break;
      goto LAB_0013bc2e;
    }
  }
LAB_0013bb05:
  if ((char)local_7c == '\x01' && 0 < (long)uVar3) {
    uVar3 = uVar3 - 1;
    *(undefined1 *)((long)__s + (uVar3 & 0xffffffff)) = 0x2b;
  }
LAB_0013bb21:
  if (field_width != 0) {
    lVar10 = 0;
    if (field_width < 0x9a26) {
      lVar10 = 0x9a25 - field_width;
    }
    while (lVar10 < (long)uVar3) {
      uVar3 = uVar3 - 1;
      *(char *)((long)__s + (uVar3 & 0xffffffff)) = fill_char_str;
    }
  }
  *(undefined1 *)((long)__s + 0x9a25) = 0;
  lVar10 = 0;
  do {
    cVar1 = *(char *)((long)__s + lVar10 + uVar3);
    str_result[lVar10] = cVar1;
    lVar10 = lVar10 + 1;
  } while (cVar1 != '\0');
  uVar3 = 0x9a26;
  goto LAB_0013beaa;
  while( true ) {
    *(byte *)((long)__s + (uVar3 & 0xffffffff)) = (byte)*local_98.elems & 7 | 0x30;
    uVar11 = 0;
    lVar10 = 0x3ffc;
    do {
      uVar2 = *(uint *)((long)local_98.elems + lVar10);
      *(uint *)((long)local_98.elems + lVar10) = uVar2 >> 3 | uVar11;
      uVar11 = uVar2 << 0x1d;
      lVar10 = lVar10 + -4;
    } while (lVar10 != -4);
    if (local_98.elem_count == 0) break;
LAB_0013bdde:
    lVar10 = 0;
    while (*(int *)((long)local_98.elems + lVar10) == 0) {
      lVar10 = lVar10 + 4;
      if ((ulong)local_98.elem_count << 2 == lVar10) goto LAB_0013ba2e;
    }
    bVar13 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar13) {
      uVar3 = 0;
      goto LAB_0013ba68;
    }
  }
LAB_0013ba2e:
  if (show_base && 0 < (long)uVar3) {
    uVar3 = uVar3 - 1;
    *(undefined1 *)((long)__s + (uVar3 & 0xffffffff)) = 0x30;
  }
  if (show_pos && 0 < (long)uVar3) {
    uVar3 = uVar3 - 1;
    *(undefined1 *)((long)__s + (uVar3 & 0xffffffff)) = 0x2b;
  }
LAB_0013ba68:
  if (field_width != 0) {
    lVar10 = 0;
    if (field_width < 0xaab3) {
      lVar10 = 0xaab2 - field_width;
    }
    while (lVar10 < (long)uVar3) {
      uVar3 = uVar3 - 1;
      *(char *)((long)__s + (uVar3 & 0xffffffff)) = fill_char_str;
    }
  }
  *(undefined1 *)((long)__s + 0xaab2) = 0;
  lVar10 = 0;
  do {
    cVar1 = *(char *)((long)__s + lVar10 + uVar3);
    str_result[lVar10] = cVar1;
    lVar10 = lVar10 + 1;
  } while (cVar1 != '\0');
  uVar3 = 0xaab3;
LAB_0013beaa:
  operator_delete(__s,uVar3);
  local_98._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_98.elem_count != 0) {
    operator_delete(local_98.elems,(ulong)local_98.elem_count << 2);
  }
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }